

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconstruction.cpp
# Opt level: O1

void lts2::RealReconstructionWithIHT
               (Mat *X,LBDOperator *LBD,Mat *realDescriptor,int iterations,float sparsityCoeff,
               Size *patchSize,float patchMean,int norm,string *wavelet)

{
  int iVar1;
  _InputArray *p_Var2;
  ostream *poVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  float fVar8;
  double dVar9;
  int wh;
  int fsize;
  int ww;
  double *Q;
  double *P;
  int local_298;
  int local_294;
  int local_290;
  float local_28c;
  _InputArray local_288;
  double local_270;
  LBDOperator *local_268;
  int local_260;
  int local_25c;
  undefined1 local_258 [16];
  undefined1 *local_248;
  undefined8 uStack_240;
  Mat *local_1f8;
  _OutputArray local_1f0;
  Mat X_im;
  undefined4 uStack_1d4;
  Size local_1c8;
  undefined8 uStack_1c0;
  int local_170;
  int local_16c;
  int local_168;
  int local_164;
  int local_160;
  int local_15c;
  Mat Ax;
  Mat nablaJ;
  Mat C0;
  
  local_298 = norm;
  local_290 = iterations;
  local_28c = patchMean;
  local_268 = LBD;
  if ((norm == 2) || (norm == 4)) {
    if ((*(uint *)realDescriptor & 0xfff) == 5) {
      local_294 = CONCAT31(local_294._1_3_,norm == 4);
      iVar5 = *(int *)(realDescriptor + 0xc);
      if (*(int *)(realDescriptor + 0xc) < *(int *)(realDescriptor + 8)) {
        iVar5 = *(int *)(realDescriptor + 8);
      }
      dVar9 = 1.0;
      if ((double)sparsityCoeff <= 1.0) {
        dVar9 = (double)sparsityCoeff;
      }
      iVar6 = patchSize->width;
      iVar1 = patchSize->height;
      local_1f8 = realDescriptor;
      fVar8 = rintf((float)(iVar1 * iVar6) * (float)(double)(~-(ulong)(dVar9 <= 0.0) & (ulong)dVar9)
                   );
      local_270 = (double)CONCAT44(local_270._4_4_,fVar8);
      local_160 = iVar6;
      local_15c = iVar1;
      cv::Mat::create(X,&local_160,5);
      local_1c8.width = 0;
      local_1c8.height = 0;
      uStack_1c0 = 0;
      _X_im = 0;
      uStack_1d4 = 0;
      _Ax = -0x3efdfffa;
      cv::noArray();
      cv::Mat::setTo((_InputArray *)X,(_InputArray *)&Ax);
      cv::Mat::Mat(&X_im);
      cv::Mat::Mat(&Ax);
      cv::Mat::Mat(&nablaJ);
      P = (double *)0x0;
      Q = (double *)0x0;
      fsize = 0;
      WaveletCoef(wavelet,&P,&Q,&fsize);
      local_168 = patchSize->width;
      local_164 = patchSize->height;
      cv::Mat::create(&X_im,&local_168,5);
      _C0 = (double)local_28c;
      local_258._0_4_ = -0x3efdfffa;
      local_248 = &DAT_400000001;
      local_258._8_8_ = &C0;
      cv::noArray();
      cv::Mat::setTo((_InputArray *)&X_im,(_InputArray *)local_258);
      WaveletTransform2D(&X_im,X,P,Q,fsize,&ww,&wh,-1);
      local_288.flags = 0;
      local_288._4_4_ = 0;
      cv::Mat::Mat((Mat *)local_258,X,(Rect_ *)&local_288);
      cv::Mat::clone();
      cv::Mat::~Mat((Mat *)local_258);
      InverseWaveletTransform2D(X,&X_im,P,Q,fsize,&ww,&wh);
      local_170 = patchSize->width;
      local_16c = patchSize->height;
      cv::Mat::create(X,&local_170,5);
      uStack_240 = 0;
      local_258._0_4_ = 0;
      local_258._4_4_ = 0;
      stack0xfffffffffffffdb0 = ZEXT816(0);
      local_288.flags = -0x3efdfffa;
      local_288.sz = (Size)&DAT_400000001;
      local_288.obj = (Mat *)local_258;
      cv::noArray();
      cv::Mat::setTo((_InputArray *)X,&local_288);
      if (local_298 == 4) {
        (*(local_268->super_LinearOperator)._vptr_LinearOperator[3])(local_268,local_1f8,&X_im);
        WaveletTransform2D(&X_im,X,P,Q,fsize,&ww,&wh,-1);
        local_258._0_4_ = 0x1010000;
        local_248 = (undefined1 *)0x0;
        local_258._8_8_ = X;
        p_Var2 = (_InputArray *)cv::noArray();
        dVar9 = (double)cv::norm((_InputArray *)local_258,4,p_Var2);
        if (0.0 < (float)dVar9) {
          local_258._0_4_ = 0x2010000;
          local_248 = (undefined1 *)0x0;
          cv::Mat::convertTo((_OutputArray *)X,(int)local_258,1.0 / (double)(float)dVar9,0.0);
        }
      }
      local_25c = (int)local_270._0_4_;
      iVar6 = 1;
      if (1 < local_290) {
        iVar6 = local_290;
      }
      local_270 = (double)(float)(*(double *)(&DAT_00115320 + (ulong)(byte)local_294 * 8) /
                                 (double)iVar5);
      local_260 = iVar6;
      do {
        InverseWaveletTransform2D(X,&X_im,P,Q,fsize,&ww,&wh);
        (*(local_268->super_LinearOperator)._vptr_LinearOperator[2])(local_268,&X_im,&Ax);
        local_258._0_4_ = 0x1010000;
        local_1f0.super__InputArray.obj = &Ax;
        local_248 = (undefined1 *)0x0;
        local_258._8_8_ = local_1f0.super__InputArray.obj;
        local_288.sz.width = 0;
        local_288.sz.height = 0;
        local_288.flags = 0x1010000;
        local_288.obj = local_1f8;
        local_1f0.super__InputArray.sz.width = 0;
        local_1f0.super__InputArray.sz.height = 0;
        local_1f0.super__InputArray.flags = -0x3dff0000;
        p_Var2 = (_InputArray *)cv::noArray();
        cv::subtract((_InputArray *)local_258,&local_288,&local_1f0,p_Var2,-1);
        iVar5 = (int)(_InputArray *)local_258;
        if (local_298 == 2) {
          local_258._0_4_ = 0x1010000;
          local_248 = (undefined1 *)0x0;
          local_258._8_8_ = &Ax;
          p_Var2 = (_InputArray *)cv::noArray();
          dVar9 = (double)cv::norm((_InputArray *)local_258,4,p_Var2);
          local_258._0_4_ = 0x2010000;
          local_248 = (undefined1 *)0x0;
          local_258._8_8_ = &Ax;
          uVar7 = -(ulong)(1e-06 < (double)(float)dVar9);
          cv::Mat::convertTo((_OutputArray *)&Ax,iVar5,
                             (double)(~uVar7 & 0x3ff0000000000000 |
                                     (ulong)(1.0 / (double)(float)dVar9) & uVar7),0.0);
        }
        (*(local_268->super_LinearOperator)._vptr_LinearOperator[3])(local_268,&Ax,&X_im);
        WaveletTransform2D(&X_im,&nablaJ,P,Q,fsize,&ww,&wh,-1);
        local_258._0_4_ = 0x2010000;
        local_248 = (undefined1 *)0x0;
        local_258._8_8_ = &nablaJ;
        local_294 = iVar6;
        cv::Mat::convertTo((_OutputArray *)&nablaJ,iVar5,local_270,0.0);
        local_258._0_4_ = 0x1010000;
        local_248 = (undefined1 *)0x0;
        local_258._8_8_ = X;
        local_288.sz.width = 0;
        local_288.sz.height = 0;
        local_288.flags = 0x1010000;
        local_1f0.super__InputArray.sz.width = 0;
        local_1f0.super__InputArray.sz.height = 0;
        local_1f0.super__InputArray.flags = -0x3dff0000;
        local_288.obj = &nablaJ;
        local_1f0.super__InputArray.obj = X;
        p_Var2 = (_InputArray *)cv::noArray();
        iVar6 = local_294;
        cv::subtract((_InputArray *)local_258,&local_288,&local_1f0,p_Var2,-1);
        ProxL0(X,local_25c);
        InverseWaveletTransform2D(X,&X_im,P,Q,fsize,&ww,&wh);
        ProxRangeConstraint(&X_im,0.0,1.0);
        ProxMeanConstraint(&X_im,local_28c);
        WaveletTransform2D(&X_im,X,P,Q,fsize,&ww,&wh,-1);
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Stopped after ",0xe)
      ;
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_260);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," iterations ",0xc);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," (max allowed was ",0x12);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_290);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      local_258._0_4_ = 0x1010000;
      local_248 = (undefined1 *)0x0;
      p_Var2 = (_InputArray *)cv::noArray();
      dVar9 = (double)cv::norm((_InputArray *)local_258,4,p_Var2);
      local_258._0_4_ = 0x2010000;
      uVar7 = -(ulong)((double)(float)dVar9 < 1e-06);
      local_248 = (undefined1 *)0x0;
      cv::Mat::convertTo((_OutputArray *)X,(int)local_258,
                         (double)(~uVar7 & (ulong)(1.0 / (double)(float)dVar9) |
                                 uVar7 & 0x3ff0000000000000),0.0);
      InverseWaveletTransform2D(X,&X_im,P,Q,fsize,&ww,&wh);
      local_258._0_4_ = 0x1010000;
      local_248 = (undefined1 *)0x0;
      local_258._8_8_ = &X_im;
      local_288.sz.width = 0;
      local_288.sz.height = 0;
      local_288.flags = 0x3010000;
      local_288.obj = X;
      p_Var2 = (_InputArray *)cv::noArray();
      cv::normalize((_InputArray *)local_258,(_InputOutputArray *)&local_288,0.0,1.0,0x20,-1,p_Var2)
      ;
      if (P != (double *)0x0) {
        operator_delete__(P);
      }
      if (Q != (double *)0x0) {
        operator_delete__(Q);
      }
      cv::Mat::~Mat(&C0);
      cv::Mat::~Mat(&nablaJ);
      cv::Mat::~Mat(&Ax);
      cv::Mat::~Mat(&X_im);
      return;
    }
    _X_im = &local_1c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&X_im,"realDescriptor.type() == CV_32F","");
    cv::error(-0xd7,(string *)&X_im,"RealReconstructionWithIHT",
              "/workspace/llm4binary/github/license_c_cmakelists/sansuiso[P]LBDReconstruction/src/LBDReconstruction/reconstruction.cpp"
              ,0x313);
  }
  _X_im = &local_1c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&X_im,"norm == cv::NORM_L1 || norm == cv::NORM_L2","");
  uVar4 = cv::error(-0xd7,(string *)&X_im,"RealReconstructionWithIHT",
                    "/workspace/llm4binary/github/license_c_cmakelists/sansuiso[P]LBDReconstruction/src/LBDReconstruction/reconstruction.cpp"
                    ,0x312);
  cv::Mat::~Mat(&C0);
  cv::Mat::~Mat(&nablaJ);
  cv::Mat::~Mat(&Ax);
  cv::Mat::~Mat(&X_im);
  _Unwind_Resume(uVar4);
}

Assistant:

void lts2::RealReconstructionWithIHT(cv::Mat &X, LBDOperator &LBD, cv::Mat const &realDescriptor,
                                     int iterations, float sparsityCoeff, cv::Size patchSize, float patchMean,
                                     int norm, std::string const &wavelet)
{
  CV_Assert(norm == cv::NORM_L1 || norm == cv::NORM_L2);
  CV_Assert(realDescriptor.type() == CV_32F);

  int const M = MAX(realDescriptor.rows, realDescriptor.cols);
  float const tau = (norm == cv::NORM_L2 ? 1.0/(float)M : 0.5/(float)M);

  sparsityCoeff = MAX(MIN(sparsityCoeff, 1.0), 0.0);
  int const K = (int)rintf( sparsityCoeff*patchSize.area() );

  X.create(patchSize, CV_32FC1);
  X.setTo(cv::Scalar(0.0));

  cv::Mat X_im;
  cv::Mat Ax;
  cv::Mat nablaJ;

  // Wavelet basis
  double *P = NULL, *Q = NULL;
  int fsize = 0, ww, wh;
  lts2::WaveletCoef(wavelet, &P, &Q, &fsize);

  X_im.create(patchSize, CV_32F);
  X_im.setTo(cv::Scalar(patchMean));
  lts2::WaveletTransform2D(X_im, X, P, Q, fsize, &ww, &wh);
  cv::Mat C0 = X(cv::Rect(0,0,ww,wh)).clone();
  lts2::InverseWaveletTransform2D(X, X_im, P, Q, fsize, &ww, &wh);

  // Special init if norm = L2
  X.create(patchSize, CV_32FC1);
  X.setTo(cv::Scalar(0.0));
  if (norm == cv::NORM_L2)
  {
    LBD.ApplyConjugate(realDescriptor, X_im);
    lts2::WaveletTransform2D(X_im, X, P, Q, fsize, &ww, &wh);
    float norm_x = cv::norm(X);
    if (norm_x > 0.0) X /= norm_x;
  }

  bool hasConverged = false;
  int iter = 0;

  while (!hasConverged)
  {
    // Back from the wavelet world
    lts2::InverseWaveletTransform2D(X, X_im, P, Q, fsize, &ww, &wh);
    LBD.Apply(X_im, Ax);
    Ax -= realDescriptor;

    // Step 1a : gradient
    if (norm == cv::NORM_L1)
    {
      float norm_error = cv::norm(Ax);
      norm_error = (norm_error > LTS2_EPSILON ? norm_error : 1.0);
      Ax /= norm_error;
    }

    LBD.ApplyConjugate(Ax, X_im);
    lts2::WaveletTransform2D(X_im, nablaJ, P, Q, fsize, &ww, &wh);
    nablaJ *= tau;

    X -= nablaJ;

    lts2::ProxL0(X, K);
    
    lts2::InverseWaveletTransform2D(X, X_im, P, Q, fsize, &ww, &wh);
    lts2::ProxRangeConstraint(X_im, 0.0, 1.0);
    lts2::ProxMeanConstraint(X_im, patchMean);
    lts2::WaveletTransform2D(X_im, X, P, Q, fsize, &ww, &wh);

    // Termination criterion
    hasConverged = (++iter >= iterations);  // Iterations count limit
    // TODO : test consistancy here (hasConverged |= ...)
  }

#ifdef DEBUG
  std::cout << "Stopped after " << iter << " iterations " << " (max allowed was " << iterations << ")" << std::endl;
#endif

  // Normalize by projecting to the sphere
  float norm_x = cv::norm(X);
  if (norm_x < LTS2_EPSILON)
    norm_x = 1.0;
  X /= norm_x;

  lts2::InverseWaveletTransform2D(X, X_im, P, Q, fsize, &ww, &wh);
  cv::normalize(X_im, X, 0.0, 1.0, cv::NORM_MINMAX);

  // Cleanup
  delete[] P;
  delete[] Q;
}